

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indent.h
# Opt level: O0

string * __thiscall re2c::indent_abi_cxx11_(string *__return_storage_ptr__,re2c *this,uint32_t ind)

{
  int iVar1;
  opt_t *poVar2;
  bool bVar3;
  int local_14;
  uint32_t ind_local;
  string *str;
  
  local_14 = (int)this;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  while( true ) {
    iVar1 = local_14;
    poVar2 = Opt::operator->((Opt *)&opts);
    bVar3 = poVar2->target != DOT;
    if (bVar3) {
      local_14 = local_14 + -1;
    }
    if (!bVar3 || iVar1 == 0) break;
    poVar2 = Opt::operator->((Opt *)&opts);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&poVar2->indString);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string indent (uint32_t ind)
{
	std::string str;

	while (opts->target != opt_t::DOT && ind-- > 0)
	{
		str += opts->indString;
	}
	return str;
}